

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

ObjectComprehensionSimple * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,Index **args_1,Local **args_2,Identifier **args_3,
          AST **args_4)

{
  ObjectComprehensionSimple *this_00;
  ObjectComprehensionSimple *local_38;
  
  this_00 = (ObjectComprehensionSimple *)operator_new(0xa0);
  ObjectComprehensionSimple::ObjectComprehensionSimple
            (this_00,args,&(*args_1)->super_AST,&(*args_2)->super_AST,*args_3,*args_4);
  local_38 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_38);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }